

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hayai_console_outputter.hpp
# Opt level: O0

void __thiscall
hayai::ConsoleOutputter::BeginOrSkipTest
          (ConsoleOutputter *this,string *fixtureName,string *testName,
          TestParametersDescriptor *parameters,size_t *runsCount,size_t *iterationsCount,bool skip)

{
  ostream *poVar1;
  char *pcVar2;
  TextColor local_4c [4];
  undefined1 local_39;
  size_t *psStack_38;
  bool skip_local;
  size_t *iterationsCount_local;
  size_t *runsCount_local;
  TestParametersDescriptor *parameters_local;
  string *testName_local;
  string *fixtureName_local;
  ConsoleOutputter *this_local;
  
  local_39 = skip;
  psStack_38 = iterationsCount;
  iterationsCount_local = runsCount;
  runsCount_local = (size_t *)parameters;
  parameters_local = (TestParametersDescriptor *)testName;
  testName_local = fixtureName;
  fixtureName_local = (string *)this;
  if (skip) {
    local_4c[3] = 4;
    poVar1 = operator<<(this->_stream,local_4c + 3);
    std::operator<<(poVar1,"[ DISABLED ]");
  }
  else {
    local_4c[2] = 3;
    poVar1 = operator<<(this->_stream,local_4c + 2);
    std::operator<<(poVar1,"[ RUN      ]");
  }
  local_4c[1] = 7;
  poVar1 = operator<<(this->_stream,local_4c + 1);
  std::operator<<(poVar1," ");
  Outputter::WriteTestNameToStream
            (this->_stream,testName_local,(string *)parameters_local,
             (TestParametersDescriptor *)runsCount_local);
  local_4c[0] = TextDefault;
  poVar1 = operator<<(this->_stream,local_4c);
  poVar1 = std::operator<<(poVar1," (");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*iterationsCount_local);
  pcVar2 = " runs, ";
  if (*iterationsCount_local == 1) {
    pcVar2 = " run, ";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*psStack_38);
  pcVar2 = " iterations per run)";
  if (*psStack_38 == 1) {
    pcVar2 = " iteration per run)";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

inline void BeginOrSkipTest(const std::string& fixtureName,
                                    const std::string& testName,
                                    const TestParametersDescriptor& parameters,
                                    const std::size_t& runsCount,
                                    const std::size_t& iterationsCount,
                                    const bool skip)
        {
            if (skip)
                _stream << Console::TextCyan << "[ DISABLED ]";
            else
                _stream << Console::TextGreen << "[ RUN      ]";

            _stream << Console::TextYellow << " ";
            WriteTestNameToStream(_stream, fixtureName, testName, parameters);
            _stream << Console::TextDefault
                    << " (" << runsCount
                    << (runsCount == 1 ? " run, " : " runs, ")
                    << iterationsCount
                    << (iterationsCount == 1 ?
                        " iteration per run)" :
                        " iterations per run)")
                    << std::endl;
        }